

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O1

size_t __thiscall clickhouse::ColumnNullable::Size(ColumnNullable *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*((this->nested_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Column[6])();
  iVar2 = (*(((this->nulls_).
              super___shared_ptr<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_Column)._vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    iVar1 = (*(((this->nulls_).
                super___shared_ptr<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Column)._vptr_Column[6])();
    return CONCAT44(extraout_var_01,iVar1);
  }
  __assert_fail("nested_->Size() == nulls_->Size()",
                "/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/columns/nullable.cpp"
                ,0x3e,"virtual size_t clickhouse::ColumnNullable::Size() const");
}

Assistant:

size_t ColumnNullable::Size() const {
    assert(nested_->Size() == nulls_->Size());
    return nulls_->Size();
}